

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_conversions2.cpp
# Opt level: O1

void __thiscall converterApp_fileConversions_Test::TestBody(converterApp_fileConversions_Test *this)

{
  _Alloc_hider _Var1;
  pointer pcVar2;
  pointer pcVar3;
  bool bVar4;
  ParamType *pPVar5;
  uint64_t uVar6;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var7;
  precise_unit *result;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_01;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_03;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_04;
  char *pcVar8;
  char *in_R9;
  pointer pcVar9;
  double dVar10;
  AssertionResult AVar11;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar;
  string testFile;
  precise_unit unit;
  precise_unit baseUnit;
  char *in_stack_fffffffffffffeb8;
  undefined1 local_140 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_138;
  internal in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffed1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  char in_stack_fffffffffffffee0;
  undefined7 in_stack_fffffffffffffee1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  AssertHelper local_100;
  string local_f8;
  converterApp *local_d8;
  double local_d0;
  string local_c8;
  string local_a8;
  precise_unit local_88;
  pointer local_78;
  double local_70;
  AssertHelper local_68;
  precise_unit local_60;
  string local_50;
  
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  local_d8 = &this->super_converterApp;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f8,
             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/files/test_conversions/"
             ,"");
  pPVar5 = testing::
           WithParamInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::GetParam();
  std::__cxx11::string::_M_append((char *)&local_f8,(ulong)(pPVar5->_M_dataplus)._M_p);
  std::__cxx11::string::append((char *)&local_f8);
  converterApp::loadFile(local_d8,&local_f8);
  pcVar9 = (local_d8->unit_conv).super__Vector_base<convValue,_std::allocator<convValue>_>._M_impl.
           super__Vector_impl_data._M_start;
  _Var1._M_p = (pcVar9->name)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,_Var1._M_p,_Var1._M_p + (pcVar9->name)._M_string_length);
  uVar6 = units::getDefaultFlags();
  local_60 = units::unit_from_string(&local_50,uVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pcVar9 = (local_d8->unit_conv).super__Vector_base<convValue,_std::allocator<convValue>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_78 = (local_d8->unit_conv).super__Vector_base<convValue,_std::allocator<convValue>_>._M_impl
             .super__Vector_impl_data._M_finish;
  if (pcVar9 != local_78) {
    local_d0 = pcVar9->value;
    do {
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      pcVar2 = (pcVar9->name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a8,pcVar2,pcVar2 + (pcVar9->name)._M_string_length);
      uVar6 = units::getDefaultFlags();
      local_88 = units::unit_from_string(&local_a8,uVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      local_140[0] = local_88.base_units_ != (unit_data)0xfa94a488 && !NAN(local_88.multiplier_);
      local_138._0_4_ = (unit_data)0x0;
      local_138._4_4_ = 0;
      if (local_88.base_units_ == (unit_data)0xfa94a488 || NAN(local_88.multiplier_)) {
        testing::Message::Message((Message *)&stack0xfffffffffffffed0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(CONCAT71(in_stack_fffffffffffffed1,in_stack_fffffffffffffed0) + 0x10)
                   ,"error converting ",0x11);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(CONCAT71(in_stack_fffffffffffffed1,in_stack_fffffffffffffed0) + 0x10)
                   ,(pcVar9->name)._M_dataplus._M_p,(pcVar9->name)._M_string_length);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&stack0xfffffffffffffee0,(internal *)local_140,
                   (AssertionResult *)"is_error(unit)","true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_100,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions2.cpp"
                   ,0x45,(char *)CONCAT71(in_stack_fffffffffffffee1,in_stack_fffffffffffffee0));
        testing::internal::AssertHelper::operator=(&local_100,(Message *)&stack0xfffffffffffffed0);
        testing::internal::AssertHelper::~AssertHelper(&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(in_stack_fffffffffffffee1,in_stack_fffffffffffffee0) != &local_110) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(in_stack_fffffffffffffee1,in_stack_fffffffffffffee0),
                          local_110._M_allocated_capacity + 1);
        }
        if ((long *)CONCAT71(in_stack_fffffffffffffed1,in_stack_fffffffffffffed0) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(in_stack_fffffffffffffed1,in_stack_fffffffffffffed0) + 8))
                    ();
        }
      }
      if (local_138 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_140 + 8),local_138);
      }
      _Var7._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (pcVar9->short_name)._M_string_length;
      if ((_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )_Var7._M_head_impl ==
          (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )0x0) {
LAB_00128522:
        local_70 = units::convert<units::precise_unit,units::precise_unit>
                             ((units *)&local_60,local_d0,&local_88,
                              (precise_unit *)_Var7._M_head_impl);
        AVar11 = testing::internal::DoubleNearPredFormat
                           (in_stack_fffffffffffffeb8,(char *)0x128574,
                            (char *)in_stack_fffffffffffffee8,
                            (double)CONCAT71(in_stack_fffffffffffffee1,in_stack_fffffffffffffee0),
                            (double)in_stack_fffffffffffffed8,
                            (double)CONCAT71(in_stack_fffffffffffffed1,in_stack_fffffffffffffed0));
        _Var7._M_head_impl =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             AVar11.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
        if (in_stack_fffffffffffffee0 == '\0') {
          testing::Message::Message((Message *)local_140);
          pcVar3 = (local_d8->unit_conv).super__Vector_base<convValue,_std::allocator<convValue>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)((long)local_140 + 0x10),(pcVar3->name)._M_dataplus._M_p,
                     (pcVar3->name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)((long)local_140 + 0x10)," to ",4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)((long)local_140 + 0x10),(pcVar9->name)._M_dataplus._M_p,
                     (pcVar9->name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)((long)local_140 + 0x10)," produced ",10);
          std::ostream::_M_insert<double>(local_70);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)((long)local_140 + 0x10)," when ",6);
          std::ostream::_M_insert<double>(pcVar9->value);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)((long)local_140 + 0x10)," expected",9);
          pcVar8 = "";
          if (in_stack_fffffffffffffee8 !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar8 = (in_stack_fffffffffffffee8->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xfffffffffffffed0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions2.cpp"
                     ,0x58,pcVar8);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xfffffffffffffed0,(Message *)local_140);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffed0);
          _Var7 = extraout_RDX_02.
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl;
          if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
               )local_140 !=
              (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            (**(code **)(*(long *)local_140 + 8))();
            _Var7._M_head_impl = extraout_RDX_03;
          }
        }
        if (in_stack_fffffffffffffee8 !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&stack0xfffffffffffffee8,in_stack_fffffffffffffee8);
          _Var7._M_head_impl =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               extraout_RDX_04.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
        }
        units::convert<units::precise_unit,units::precise_unit>
                  ((units *)&local_88,pcVar9->value,&local_60,(precise_unit *)_Var7._M_head_impl);
        testing::internal::DoubleNearPredFormat
                  (in_stack_fffffffffffffeb8,(char *)0x1286ff,(char *)in_stack_fffffffffffffee8,
                   (double)CONCAT71(in_stack_fffffffffffffee1,in_stack_fffffffffffffee0),
                   (double)in_stack_fffffffffffffed8,
                   (double)CONCAT71(in_stack_fffffffffffffed1,in_stack_fffffffffffffed0));
        if (in_stack_fffffffffffffee0 == '\0') {
          testing::Message::Message((Message *)local_140);
          pcVar8 = "";
          if (in_stack_fffffffffffffee8 !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar8 = (in_stack_fffffffffffffee8->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xfffffffffffffed0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions2.cpp"
                     ,0x5c,pcVar8);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xfffffffffffffed0,(Message *)local_140);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffed0);
          if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
               )local_140 !=
              (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            (**(code **)(*(long *)local_140 + 8))();
          }
        }
        if (in_stack_fffffffffffffee8 !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&stack0xfffffffffffffee8,in_stack_fffffffffffffee8);
        }
      }
      else {
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        pcVar2 = (pcVar9->short_name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c8,pcVar2,
                   pcVar2 + (long)&((_Var7._M_head_impl)->_M_dataplus)._M_p);
        uVar6 = units::getDefaultFlags();
        _local_140 = units::unit_from_string(&local_c8,uVar6);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        in_stack_fffffffffffffed0 =
             (internal)(local_138._0_4_ != (unit_data)0xfa94a488 && !NAN((double)local_140));
        in_stack_fffffffffffffed8 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_138._0_4_ == (unit_data)0xfa94a488 || NAN((double)local_140)) {
          testing::Message::Message((Message *)&local_100);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(local_100.data_)->line,"error converting ",0x11);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(local_100.data_)->line,(pcVar9->short_name)._M_dataplus._M_p,
                     (pcVar9->short_name)._M_string_length);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&stack0xfffffffffffffee0,(internal *)&stack0xfffffffffffffed0,
                     (AssertionResult *)"is_error(unit_short)","true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_68,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions2.cpp"
                     ,0x48,(char *)CONCAT71(in_stack_fffffffffffffee1,in_stack_fffffffffffffee0));
          testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_100);
          testing::internal::AssertHelper::~AssertHelper(&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(in_stack_fffffffffffffee1,in_stack_fffffffffffffee0) != &local_110) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(in_stack_fffffffffffffee1,in_stack_fffffffffffffee0),
                            local_110._M_allocated_capacity + 1);
          }
          if (local_100.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_100.data_ + 8))();
          }
        }
        if (in_stack_fffffffffffffed8 !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&stack0xfffffffffffffed8,in_stack_fffffffffffffed8);
        }
        bVar4 = units::precise_unit::operator==(&local_88,(precise_unit *)local_140);
        if (bVar4) {
          AVar11 = testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
                             ((internal *)&stack0xfffffffffffffee0,"unit","unit_short",&local_88,
                              (precise_unit *)local_140);
          _Var7._M_head_impl =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               AVar11.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
          if (in_stack_fffffffffffffee0 == '\0') {
            testing::Message::Message((Message *)&stack0xfffffffffffffed0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)
                       (CONCAT71(in_stack_fffffffffffffed1,in_stack_fffffffffffffed0) + 0x10),
                       (pcVar9->name)._M_dataplus._M_p,(pcVar9->name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)
                       (CONCAT71(in_stack_fffffffffffffed1,in_stack_fffffffffffffed0) + 0x10),
                       " and ",5);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)
                       (CONCAT71(in_stack_fffffffffffffed1,in_stack_fffffffffffffed0) + 0x10),
                       (pcVar9->short_name)._M_dataplus._M_p,(pcVar9->short_name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)
                       (CONCAT71(in_stack_fffffffffffffed1,in_stack_fffffffffffffed0) + 0x10),
                       " do not produce the same unit",0x1d);
            pcVar8 = "";
            if (in_stack_fffffffffffffee8 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar8 = (in_stack_fffffffffffffee8->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_100,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions2.cpp"
                       ,0x52,pcVar8);
            testing::internal::AssertHelper::operator=
                      (&local_100,(Message *)&stack0xfffffffffffffed0);
LAB_001284f6:
            testing::internal::AssertHelper::~AssertHelper(&local_100);
            _Var7 = extraout_RDX.
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl;
            if ((long *)CONCAT71(in_stack_fffffffffffffed1,in_stack_fffffffffffffed0) != (long *)0x0
               ) {
              (**(code **)(*(long *)CONCAT71(in_stack_fffffffffffffed1,in_stack_fffffffffffffed0) +
                          8))();
              _Var7._M_head_impl = extraout_RDX_00;
            }
          }
LAB_0012850e:
          if (in_stack_fffffffffffffee8 !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&stack0xfffffffffffffee8,in_stack_fffffffffffffee8);
            _Var7._M_head_impl =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 extraout_RDX_01.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
          }
          goto LAB_00128522;
        }
        bVar4 = units::precise_unit::operator==(&local_88,(precise_unit *)units::precise::log::bel);
        if (!bVar4) {
          dVar10 = units::convert<units::precise_unit,units::precise_unit>
                             ((units *)&local_88,1.0,(precise_unit *)local_140,result);
          AVar11 = testing::internal::CmpHelperFloatingPointEQ<float>
                             ((internal *)&stack0xfffffffffffffee0,"convert(1.0, unit, unit_short)",
                              "1.0F",(float)dVar10,1.0);
          _Var7._M_head_impl =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               AVar11.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
          if (in_stack_fffffffffffffee0 == '\0') {
            testing::Message::Message((Message *)&stack0xfffffffffffffed0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)
                       (CONCAT71(in_stack_fffffffffffffed1,in_stack_fffffffffffffed0) + 0x10),
                       (pcVar9->short_name)._M_dataplus._M_p,(pcVar9->short_name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)
                       (CONCAT71(in_stack_fffffffffffffed1,in_stack_fffffffffffffed0) + 0x10),
                       " and ",5);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)
                       (CONCAT71(in_stack_fffffffffffffed1,in_stack_fffffffffffffed0) + 0x10),
                       (pcVar9->name)._M_dataplus._M_p,(pcVar9->name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)
                       (CONCAT71(in_stack_fffffffffffffed1,in_stack_fffffffffffffed0) + 0x10),
                       " do not match",0xd);
            pcVar8 = "";
            if (in_stack_fffffffffffffee8 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar8 = (in_stack_fffffffffffffee8->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_100,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions2.cpp"
                       ,0x4e,pcVar8);
            testing::internal::AssertHelper::operator=
                      (&local_100,(Message *)&stack0xfffffffffffffed0);
            goto LAB_001284f6;
          }
          goto LAB_0012850e;
        }
      }
      pcVar9 = pcVar9 + 1;
    } while (pcVar9 != local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST_P(converterApp, fileConversions)
{
    std::string testFile = TEST_FILE_FOLDER "/test_conversions/";
    testFile.append(GetParam());
    testFile.append("_conversions.txt");
    loadFile(testFile);
    auto baseUnit = units::unit_from_string(unit_conv[0].name);
    double baseValue = unit_conv[0].value;
    for (auto& convcode : unit_conv) {
        auto unit = units::unit_from_string(convcode.name);
        EXPECT_FALSE(is_error(unit)) << "error converting " << convcode.name;
        if (!convcode.short_name.empty()) {
            auto unit_short = units::unit_from_string(convcode.short_name);
            EXPECT_FALSE(is_error(unit_short))
                << "error converting " << convcode.short_name;
            if (unit != unit_short) {
                if (unit == units::precise::log::bel) {
                    continue;  // this is a known choice to match SI
                }
                EXPECT_FLOAT_EQ(convert(1.0, unit, unit_short), 1.0F)
                    << convcode.short_name << " and " << convcode.name
                    << " do not match";
            } else {
                EXPECT_EQ(unit, unit_short)
                    << convcode.name << " and " << convcode.short_name
                    << " do not produce the same unit";
            }
        }
        double res = units::convert(baseValue, baseUnit, unit);
        EXPECT_NEAR(res / convcode.value, 1.0, 0.003)
            << unit_conv[0].name << " to " << convcode.name << " produced "
            << res << " when " << convcode.value << " expected";
        double return_value = units::convert(convcode.value, unit, baseUnit);
        EXPECT_NEAR(return_value / baseValue, 1.0, 0.003);
    }
}